

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

sxi32 VmHttpSplitEncodedQuery(jx9_vm *pVm,SyString *pQuery,SyBlob *pWorker,int is_post)

{
  char cVar1;
  uint nKeylen;
  char *zKey;
  bool bVar2;
  long lVar3;
  jx9_value *pjVar4;
  jx9_value *pjVar5;
  jx9_value *pjVar6;
  undefined4 in_register_0000000c;
  void *pUserData;
  sxu32 nByte;
  char *pcVar7;
  ulong uVar8;
  ulong uVar9;
  int in_R8D;
  SyString *pSVar10;
  int iVar11;
  SyString *pSVar12;
  SyString *zSrc;
  
  pUserData = (void *)CONCAT44(in_register_0000000c,is_post);
  if (in_R8D == 0) {
    pcVar7 = "_GET";
    nByte = 4;
  }
  else {
    pcVar7 = "_POST";
    nByte = 5;
  }
  pjVar4 = VmExtractSuper(pVm,pcVar7,nByte);
  pjVar5 = VmExtractSuper(pVm,"_REQUEST",8);
  pjVar6 = pjVar5;
  if ((int)pWorker != 0) {
    pSVar10 = (SyString *)((long)&pQuery->zString + ((ulong)pWorker & 0xffffffff));
    pjVar6 = (jx9_value *)__ctype_b_loc();
    do {
      uVar8 = (ulong)pQuery & 0xffffffff;
      while (iVar11 = (int)uVar8,
            (*(byte *)((pjVar6->x).iVal + 1 + (long)*(char *)&pQuery->zString * 2) & 0x20) != 0) {
        pQuery = (SyString *)((long)&pQuery->zString + 1);
        uVar8 = (ulong)(iVar11 + 1);
        if (pSVar10 <= pQuery) goto LAB_001222b4;
      }
      pSVar12 = pQuery;
      if (pQuery < pSVar10) {
        do {
          if (((ulong)*(byte *)&pSVar12->zString < 0x3e) &&
             ((0x2800004000000000U >> ((ulong)*(byte *)&pSVar12->zString & 0x3f) & 1) != 0)) {
            bVar2 = true;
            goto LAB_0012217f;
          }
          pSVar12 = (SyString *)((long)&pSVar12->zString + 1);
        } while (pSVar12 < pSVar10);
        bVar2 = false;
      }
      else {
        bVar2 = false;
      }
LAB_0012217f:
      *(undefined4 *)((long)pUserData + 0x10) = 0;
      if ((*(uint *)((long)pUserData + 0x18) & 4) != 0) {
        *(undefined8 *)((long)pUserData + 8) = 0;
        *(undefined4 *)((long)pUserData + 0x14) = 0;
        *(uint *)((long)pUserData + 0x18) = *(uint *)((long)pUserData + 0x18) & 0xfffffffb;
      }
      SyUriDecode((char *)pQuery,(int)pSVar12 - iVar11,jx9VmBlobConsumer,pUserData,iVar11);
      nKeylen = *(uint *)((long)pUserData + 0x10);
      if ((bVar2) && (*(char *)&pSVar12->zString == '=')) {
        zSrc = (SyString *)((long)&pSVar12->zString + 1);
        if (zSrc < pSVar10) {
          uVar8 = 1;
          do {
            cVar1 = *(char *)((long)&pSVar12->zString + uVar8);
            uVar9 = uVar8;
            if ((cVar1 == '&') || (cVar1 == ';')) break;
            lVar3 = uVar8 + 1;
            uVar8 = uVar8 + 1;
            uVar9 = (long)pSVar10 - (long)pSVar12;
          } while ((SyString *)((long)&pSVar12->zString + lVar3) < pSVar10);
          pSVar12 = (SyString *)((long)&pSVar12->zString + uVar8);
          if (uVar9 < 2) goto LAB_00122232;
          SyUriDecode((char *)zSrc,(int)uVar9 - 1,jx9VmBlobConsumer,pUserData,iVar11);
          pcVar7 = (char *)(*(long *)((long)pUserData + 8) + (ulong)nKeylen);
          iVar11 = *(int *)((long)pUserData + 0x10) - nKeylen;
          zSrc = pSVar12;
        }
        else {
          iVar11 = 0;
          pcVar7 = (char *)0x0;
        }
      }
      else {
LAB_00122232:
        iVar11 = 0;
        pcVar7 = (char *)0x0;
        zSrc = pSVar12;
      }
      zKey = *(char **)((long)pUserData + 8);
      if ((pjVar4 != (jx9_value *)0x0) && ((pjVar4->iFlags & 0x40) != 0)) {
        VmHashmapInsert((jx9_hashmap *)(pjVar4->x).pOther,zKey,nKeylen,pcVar7,iVar11);
      }
      if ((pjVar5 != (jx9_value *)0x0) && ((pjVar5->iFlags & 0x40) != 0)) {
        VmHashmapInsert((jx9_hashmap *)(pjVar5->x).pOther,zKey,nKeylen,pcVar7,iVar11);
      }
      pQuery = (SyString *)((long)&zSrc->zString + 1);
    } while (pQuery < pSVar10);
  }
LAB_001222b4:
  return (sxi32)pjVar6;
}

Assistant:

static sxi32 VmHttpSplitEncodedQuery(
	 jx9_vm *pVm,       /* Target VM */
	 SyString *pQuery,  /* Raw query to decode */
	 SyBlob *pWorker,   /* Working buffer */
	 int is_post        /* TRUE if we are dealing with a POST request */
	 )
 {
	 const char *zEnd = &pQuery->zString[pQuery->nByte];
	 const char *zIn = pQuery->zString;
	 jx9_value *pGet, *pRequest;
	 SyString sName, sValue;
	 const char *zPtr;
	 sxu32 nBlobOfft;
	 /* Extract superglobals */
	 if( is_post ){
		 /* $_POST superglobal */
		 pGet = VmExtractSuper(&(*pVm), "_POST", sizeof("_POST")-1);
	 }else{
		 /* $_GET superglobal */
		 pGet = VmExtractSuper(&(*pVm), "_GET", sizeof("_GET")-1);
	 }
	 pRequest = VmExtractSuper(&(*pVm), "_REQUEST", sizeof("_REQUEST")-1);
	 /* Split up the raw query */
	 for(;;){
		 /* Jump leading white spaces */
		 while(zIn < zEnd  && SyisSpace(zIn[0]) ){
			 zIn++;
		 }
		 if( zIn >= zEnd ){
			 break;
		 }
		 zPtr = zIn;
		 while( zPtr < zEnd && zPtr[0] != '=' && zPtr[0] != '&' && zPtr[0] != ';' ){
			 zPtr++;
		 }
		 /* Reset the working buffer */
		 SyBlobReset(pWorker);
		 /* Decode the entry */
		 SyUriDecode(zIn, (sxu32)(zPtr-zIn), jx9VmBlobConsumer, pWorker, TRUE);
		 /* Save the entry */
		 sName.nByte = SyBlobLength(pWorker);
		 sValue.zString = 0;
		 sValue.nByte = 0;
		 if( zPtr < zEnd && zPtr[0] == '=' ){
			 zPtr++;
			 zIn = zPtr;
			 /* Store field value */
			 while( zPtr < zEnd && zPtr[0] != '&' && zPtr[0] != ';' ){
				 zPtr++;
			 }
			 if( zPtr > zIn ){
				 /* Decode the value */
				  nBlobOfft = SyBlobLength(pWorker);
				  SyUriDecode(zIn, (sxu32)(zPtr-zIn), jx9VmBlobConsumer, pWorker, TRUE);
				  sValue.zString = (const char *)SyBlobDataAt(pWorker, nBlobOfft);
				  sValue.nByte = SyBlobLength(pWorker) - nBlobOfft;
				 
			 }
			 /* Synchronize pointers */
			 zIn = zPtr;
		 }
		 sName.zString = (const char *)SyBlobData(pWorker);
		 /* Install the decoded query in the $_GET/$_REQUEST array */
		 if( pGet && (pGet->iFlags & MEMOBJ_HASHMAP) ){
			 VmHashmapInsert((jx9_hashmap *)pGet->x.pOther, 
				 sName.zString, (int)sName.nByte, 
				 sValue.zString, (int)sValue.nByte
				 );
		 }
		 if( pRequest && (pRequest->iFlags & MEMOBJ_HASHMAP) ){
			 VmHashmapInsert((jx9_hashmap *)pRequest->x.pOther, 
				 sName.zString, (int)sName.nByte, 
				 sValue.zString, (int)sValue.nByte
					 );
		 }
		 /* Advance the pointer */
		 zIn = &zPtr[1];
	 }
	/* All done*/
	return SXRET_OK;
 }